

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

void spvtools::utils::PrintTimerDescription(ostream *out,bool measure_mem_usage)

{
  if (out != (ostream *)0x0) {
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x1e;
    std::__ostream_insert<char,std::char_traits<char>>(out,"PASS name",9);
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(out,"CPU time",8);
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(out,"WALL time",9);
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(out,"USR time",8);
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(out,"SYS time",8);
    if (measure_mem_usage) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
      std::__ostream_insert<char,std::char_traits<char>>(out,"RSS delta",9);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>(out,"PGFault delta",0xd);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void PrintTimerDescription(std::ostream* out, bool measure_mem_usage) {
  if (out) {
    *out << std::setw(30) << "PASS name" << std::setw(12) << "CPU time"
         << std::setw(12) << "WALL time" << std::setw(12) << "USR time"
         << std::setw(12) << "SYS time";
    if (measure_mem_usage) {
      *out << std::setw(12) << "RSS delta" << std::setw(16) << "PGFault delta";
    }
    *out << std::endl;
  }
}